

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double normal_truncated_ab_variance(double mu,double s,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double x;
  double x_00;
  double dVar5;
  
  x = (a - mu) / s;
  x_00 = (b - mu) / s;
  dVar1 = exp(x * -0.5 * x);
  dVar2 = exp(x_00 * -0.5 * x_00);
  dVar3 = normal_01_cdf(x);
  dVar4 = normal_01_cdf(x_00);
  dVar5 = (dVar1 / 2.5066282746310002 - dVar2 / 2.5066282746310002) / (dVar4 - dVar3);
  return (((x * (dVar1 / 2.5066282746310002) - x_00 * (dVar2 / 2.5066282746310002)) /
           (dVar4 - dVar3) + 1.0) - dVar5 * dVar5) * s * s;
}

Assistant:

double normal_truncated_ab_variance ( double mu, double s, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_VARIANCE returns the variance of the truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Output, double NORMAL_TRUNCATED_AB_VARIANCE, the variance of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double alpha_pdf;
  double beta;
  double beta_cdf;
  double beta_pdf;
  double variance;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;

  alpha_pdf = normal_01_pdf ( alpha );
  beta_pdf = normal_01_pdf ( beta );

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta );

  variance = s * s * ( 1.0 
    + ( alpha * alpha_pdf - beta * beta_pdf ) / ( beta_cdf - alpha_cdf ) 
    - pow ( ( alpha_pdf - beta_pdf ) / ( beta_cdf - alpha_cdf ), 2 ) );

  return variance;
}